

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ReadFileInitGlobal(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  FunctionData *pFVar1;
  pointer pRVar2;
  pointer puVar3;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::ReadFileGlobalState_*,_false> local_20;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  local_20._M_head_impl = (ReadFileGlobalState *)operator_new(0x48);
  ((local_20._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__ReadFileGlobalState_02495a08;
  ((local_20._M_head_impl)->current_file_idx).super___atomic_base<unsigned_long>._M_i = 0;
  ((local_20._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_20._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_20._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_20._M_head_impl)->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_20._M_head_impl)->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&((local_20._M_head_impl)->column_ids).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&((local_20._M_head_impl)->column_ids).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  pRVar2 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_20);
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::operator=
            (&(pRVar2->files).
              super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>,
             (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)(pFVar1 + 4));
  pRVar2 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_20);
  LOCK();
  (pRVar2->current_file_idx).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pRVar2 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_20);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pRVar2->column_ids,
             &(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  puVar3 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar3 == (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_0156a68e:
      *(ReadFileGlobalState **)this = local_20._M_head_impl;
      return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
              )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                )this;
    }
    if ((*puVar3 != 0) && (*puVar3 != 0xffffffffffffffff)) {
      pRVar2 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
               ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                             *)&local_20);
      pRVar2->requires_file_open = true;
      goto LAB_0156a68e;
    }
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

static unique_ptr<GlobalTableFunctionState> ReadFileInitGlobal(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ReadFileBindData>();
	auto result = make_uniq<ReadFileGlobalState>();

	result->files = bind_data.files;
	result->current_file_idx = 0;
	result->column_ids = input.column_ids;

	for (const auto &column_id : input.column_ids) {
		// For everything except the 'file' name column, we need to open the file
		if (column_id != ReadFileBindData::FILE_NAME_COLUMN && column_id != COLUMN_IDENTIFIER_ROW_ID) {
			result->requires_file_open = true;
			break;
		}
	}

	return std::move(result);
}